

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O1

int __thiscall deqp::egl::MakeCurrentPerfTests::init(MakeCurrentPerfTests *this,EVP_PKEY_CTX *ctx)

{
  SurfaceType SVar1;
  EglTestContext *pEVar2;
  _Alloc_hider _Var3;
  int extraout_EAX;
  TestCaseGroup *pTVar4;
  MakeCurrentPerfCase *pMVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Spec spec;
  string local_a0;
  string local_80;
  Spec local_60;
  long local_48;
  long local_40;
  long local_38;
  
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"simple",
             "Simple eglMakeCurrent performance tests using single context and surface");
  lVar6 = 0;
  do {
    SVar1 = (&DAT_0034fa40)[lVar6];
    iVar9 = 1;
    do {
      local_60.contextCount = 1;
      local_60.surfaceCount = 1;
      local_60.release = iVar9 == 0;
      iVar9 = iVar9 + -1;
      local_60.iterationCount = 100;
      local_60.sampleCount = 100;
      local_60.surfaceTypes = SVar1;
      pMVar5 = (MakeCurrentPerfCase *)operator_new(0x128);
      pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
      MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_80,&local_60);
      _Var3._M_p = local_80._M_dataplus._M_p;
      MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_a0,&local_60);
      MakeCurrentPerfCase::MakeCurrentPerfCase
                (pMVar5,pEVar2,&local_60,_Var3._M_p,local_a0._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pMVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    } while (iVar9 == 0);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"multi_context",
             "eglMakeCurrent performance tests using multiple contexts and single surface");
  lVar6 = 0;
  do {
    iVar9 = (&DAT_0034f668)[lVar6];
    lVar7 = 0;
    local_48 = lVar6;
    do {
      SVar1 = (&DAT_0034fa40)[lVar7];
      iVar8 = 1;
      do {
        local_60.surfaceCount = 1;
        local_60.contextCount = iVar9;
        local_60.release = iVar8 == 0;
        iVar8 = iVar8 + -1;
        local_60.iterationCount = 100;
        local_60.sampleCount = 100;
        local_60.surfaceTypes = SVar1;
        pMVar5 = (MakeCurrentPerfCase *)operator_new(0x128);
        pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_80,&local_60);
        _Var3._M_p = local_80._M_dataplus._M_p;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_a0,&local_60);
        MakeCurrentPerfCase::MakeCurrentPerfCase
                  (pMVar5,pEVar2,&local_60,_Var3._M_p,local_a0._M_dataplus._M_p);
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pMVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      } while (iVar8 == 0);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar6 = local_48 + 1;
  } while (local_48 == 0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"multi_surface",
             "eglMakeCurrent performance tests using single context and multiple surfaces");
  lVar6 = 0;
  do {
    iVar9 = (&DAT_0034f668)[lVar6];
    lVar7 = 0;
    local_48 = lVar6;
    do {
      SVar1 = (&DAT_0034fa50)[lVar7];
      iVar8 = 1;
      do {
        local_60.surfaceCount = iVar9;
        local_60.contextCount = 1;
        local_60.release = iVar8 == 0;
        iVar8 = iVar8 + -1;
        local_60.iterationCount = 100;
        local_60.sampleCount = 100;
        local_60.surfaceTypes = SVar1;
        pMVar5 = (MakeCurrentPerfCase *)operator_new(0x128);
        pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_80,&local_60);
        _Var3._M_p = local_80._M_dataplus._M_p;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_a0,&local_60);
        MakeCurrentPerfCase::MakeCurrentPerfCase
                  (pMVar5,pEVar2,&local_60,_Var3._M_p,local_a0._M_dataplus._M_p);
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pMVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      } while (iVar8 == 0);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
    lVar6 = local_48 + 1;
  } while (local_48 == 0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"complex",
             "eglMakeCurrent performance tests using multiple contexts and multiple surfaces");
  lVar6 = 0;
  do {
    iVar9 = (&DAT_0034f668)[lVar6];
    lVar7 = 0;
    local_40 = lVar6;
    do {
      iVar8 = (&DAT_0034f668)[lVar7];
      lVar6 = 0;
      local_38 = lVar7;
      do {
        SVar1 = (&DAT_0034fa50)[lVar6];
        iVar10 = 1;
        local_48 = lVar6;
        do {
          local_60.surfaceCount = iVar9;
          local_60.contextCount = iVar8;
          local_60.release = iVar10 == 0;
          iVar10 = iVar10 + -1;
          local_60.iterationCount = 100;
          local_60.sampleCount = 100;
          local_60.surfaceTypes = SVar1;
          pMVar5 = (MakeCurrentPerfCase *)operator_new(0x128);
          pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
          MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_80,&local_60);
          _Var3._M_p = local_80._M_dataplus._M_p;
          MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_a0,&local_60);
          MakeCurrentPerfCase::MakeCurrentPerfCase
                    (pMVar5,pEVar2,&local_60,_Var3._M_p,local_a0._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pMVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        } while (iVar10 == 0);
        lVar6 = local_48 + 1;
      } while (lVar6 != 7);
      lVar7 = local_38 + 1;
    } while (local_38 == 0);
    lVar6 = local_40 + 1;
  } while (local_40 == 0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  return extraout_EAX;
}

Assistant:

void MakeCurrentPerfTests::init (void)
{
	const int iterationCount	= 100;
	const int sampleCount		= 100;

	// Add simple test group
	{
		TestCaseGroup* simple = new TestCaseGroup(m_eglTestCtx, "simple", "Simple eglMakeCurrent performance tests using single context and surface");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
			{
				MakeCurrentPerfCase::Spec spec;

				spec.surfaceTypes	= types[typeNdx];
				spec.contextCount	= 1;
				spec.surfaceCount	= 1;
				spec.release		= (releaseNdx == 1);
				spec.iterationCount	= iterationCount;
				spec.sampleCount	= sampleCount;

				simple->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
			}
		}

		addChild(simple);
	}

	// Add multi context test group
	{
		TestCaseGroup* multiContext = new TestCaseGroup(m_eglTestCtx, "multi_context", "eglMakeCurrent performance tests using multiple contexts and single surface");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW
		};

		const int contextCounts[] = {
			10, 100
		};

		for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(contextCounts); contextCountNdx++)
		{
			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
			{
				for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
				{
					MakeCurrentPerfCase::Spec spec;

					spec.surfaceTypes	= types[typeNdx];
					spec.contextCount	= contextCounts[contextCountNdx];
					spec.surfaceCount	= 1;
					spec.release		= (releaseNdx == 1);
					spec.iterationCount	= iterationCount;
					spec.sampleCount	= sampleCount;

					multiContext->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
				}
			}
		}

		addChild(multiContext);
	}

	// Add multi surface test group
	{
		TestCaseGroup* multiSurface = new TestCaseGroup(m_eglTestCtx, "multi_surface", "eglMakeCurrent performance tests using single context and multiple surfaces");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW,

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_PIXMAP),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PIXMAP	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER|MakeCurrentPerfCase::SURFACETYPE_PIXMAP|MakeCurrentPerfCase::SURFACETYPE_WINDOW)
		};

		const int surfaceCounts[] = {
			10, 100
		};

		for (int surfaceCountNdx = 0; surfaceCountNdx < DE_LENGTH_OF_ARRAY(surfaceCounts); surfaceCountNdx++)
		{
			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
			{
				for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
				{
					MakeCurrentPerfCase::Spec spec;

					spec.surfaceTypes	= types[typeNdx];
					spec.surfaceCount	= surfaceCounts[surfaceCountNdx];
					spec.contextCount	= 1;
					spec.release		= (releaseNdx == 1);
					spec.iterationCount	= iterationCount;
					spec.sampleCount	= sampleCount;

					multiSurface->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
				}
			}
		}

		addChild(multiSurface);
	}

	// Add Complex? test group
	{
		TestCaseGroup* multi = new TestCaseGroup(m_eglTestCtx, "complex", "eglMakeCurrent performance tests using multiple contexts and multiple surfaces");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW,

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_PIXMAP),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PIXMAP	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER|MakeCurrentPerfCase::SURFACETYPE_PIXMAP|MakeCurrentPerfCase::SURFACETYPE_WINDOW)
		};

		const int surfaceCounts[] = {
			10, 100
		};


		const int contextCounts[] = {
			10, 100
		};

		for (int surfaceCountNdx = 0; surfaceCountNdx < DE_LENGTH_OF_ARRAY(surfaceCounts); surfaceCountNdx++)
		{
			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(contextCounts); contextCountNdx++)
			{
				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
				{
					for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
					{
						MakeCurrentPerfCase::Spec spec;

						spec.surfaceTypes	= types[typeNdx];
						spec.contextCount	= contextCounts[contextCountNdx];
						spec.surfaceCount	= surfaceCounts[surfaceCountNdx];
						spec.release		= (releaseNdx == 1);
						spec.iterationCount	= iterationCount;
						spec.sampleCount	= sampleCount;

						multi->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
					}
				}
			}
		}

		addChild(multi);
	}
}